

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestSemantic.cpp
# Opt level: O0

void __thiscall UnitTest_semantic11::Run(UnitTest_semantic11 *this)

{
  bool bVar1;
  byte bVar2;
  SemanticException *anon_var_0_1;
  SemanticException *anon_var_0;
  unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *in_stack_fffffffffffffd50;
  allocator *this_00;
  allocator *in_stack_fffffffffffffd78;
  undefined7 in_stack_fffffffffffffd80;
  undefined1 in_stack_fffffffffffffd87;
  allocator local_229;
  string local_228 [39];
  allocator local_201;
  string local_200 [55];
  allocator local_1c9;
  string local_1c8 [39];
  allocator local_1a1;
  string local_1a0 [47];
  allocator local_171;
  string local_170 [39];
  allocator local_149;
  string local_148 [47];
  allocator local_119;
  string local_118 [39];
  allocator local_f1;
  string local_f0 [47];
  allocator local_c1;
  string local_c0 [39];
  allocator local_99;
  string local_98 [47];
  allocator local_69;
  string local_68 [55];
  allocator local_31;
  string local_30 [48];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,"a = \'str\' .. \'str\'",&local_31);
  anon_unknown.dwarf_fc1b::Semantic((string *)in_stack_fffffffffffffd78);
  bVar1 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
                     0x1a85d6);
  std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::~unique_ptr
            (in_stack_fffffffffffffd50);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_68,"\'Semantic(\"a = \'str\' .. \'str\'\")\'",&local_69);
    UnitTestBase::Error((UnitTestBase *)
                        CONCAT17(in_stack_fffffffffffffd87,in_stack_fffffffffffffd80),
                        (string *)in_stack_fffffffffffffd78);
    std::__cxx11::string::~string(local_68);
    std::allocator<char>::~allocator((allocator<char> *)&local_69);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_98,"a = 1 .. \'str\'",&local_99);
  anon_unknown.dwarf_fc1b::Semantic((string *)in_stack_fffffffffffffd78);
  bVar1 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
                     0x1a875a);
  std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::~unique_ptr
            (in_stack_fffffffffffffd50);
  std::__cxx11::string::~string(local_98);
  std::allocator<char>::~allocator((allocator<char> *)&local_99);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_c0,"\'Semantic(\"a = 1 .. \'str\'\")\'",&local_c1);
    UnitTestBase::Error((UnitTestBase *)
                        CONCAT17(in_stack_fffffffffffffd87,in_stack_fffffffffffffd80),
                        (string *)in_stack_fffffffffffffd78);
    std::__cxx11::string::~string(local_c0);
    std::allocator<char>::~allocator((allocator<char> *)&local_c1);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_f0,"a = \'str\' .. 1",&local_f1);
  anon_unknown.dwarf_fc1b::Semantic((string *)in_stack_fffffffffffffd78);
  bVar1 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
                     0x1a88de);
  bVar2 = bVar1 ^ 0xff;
  std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::~unique_ptr
            (in_stack_fffffffffffffd50);
  std::__cxx11::string::~string(local_f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_f1);
  if ((bVar2 & 1) != 0) {
    in_stack_fffffffffffffd78 = &local_119;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_118,"\'Semantic(\"a = \'str\' .. 1\")\'",in_stack_fffffffffffffd78);
    UnitTestBase::Error((UnitTestBase *)CONCAT17(bVar2,in_stack_fffffffffffffd80),
                        (string *)in_stack_fffffffffffffd78);
    std::__cxx11::string::~string(local_118);
    std::allocator<char>::~allocator((allocator<char> *)&local_119);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_148,"a = \'str\' .. b",&local_149);
  anon_unknown.dwarf_fc1b::Semantic((string *)in_stack_fffffffffffffd78);
  bVar1 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
                     0x1a8a62);
  std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::~unique_ptr
            (in_stack_fffffffffffffd50);
  std::__cxx11::string::~string(local_148);
  std::allocator<char>::~allocator((allocator<char> *)&local_149);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_170,"\'Semantic(\"a = \'str\' .. b\")\'",&local_171);
    UnitTestBase::Error((UnitTestBase *)CONCAT17(bVar2,in_stack_fffffffffffffd80),
                        (string *)in_stack_fffffffffffffd78);
    std::__cxx11::string::~string(local_170);
    std::allocator<char>::~allocator((allocator<char> *)&local_171);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1a0,"a = 1 .. 1",&local_1a1);
  anon_unknown.dwarf_fc1b::Semantic((string *)in_stack_fffffffffffffd78);
  std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::~unique_ptr
            (in_stack_fffffffffffffd50);
  std::__cxx11::string::~string(local_1a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1a1);
  this_00 = &local_1c9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_1c8,"\'{ Semantic(\"a = 1 .. 1\"); }\' has no luna::SemanticException",this_00);
  UnitTestBase::Error((UnitTestBase *)CONCAT17(bVar2,in_stack_fffffffffffffd80),
                      (string *)in_stack_fffffffffffffd78);
  std::__cxx11::string::~string(local_1c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1c9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_200,"a = true .. nil",&local_201);
  anon_unknown.dwarf_fc1b::Semantic((string *)in_stack_fffffffffffffd78);
  std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::~unique_ptr
            ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)this_00);
  std::__cxx11::string::~string(local_200);
  std::allocator<char>::~allocator((allocator<char> *)&local_201);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_228,"\'{ Semantic(\"a = true .. nil\"); }\' has no luna::SemanticException",
             &local_229);
  UnitTestBase::Error((UnitTestBase *)CONCAT17(bVar2,in_stack_fffffffffffffd80),
                      (string *)in_stack_fffffffffffffd78);
  std::__cxx11::string::~string(local_228);
  std::allocator<char>::~allocator((allocator<char> *)&local_229);
  return;
}

Assistant:

TEST_CASE(semantic11)
{
    EXPECT_TRUE(Semantic("a = 'str' .. 'str'"));
    EXPECT_TRUE(Semantic("a = 1 .. 'str'"));
    EXPECT_TRUE(Semantic("a = 'str' .. 1"));
    EXPECT_TRUE(Semantic("a = 'str' .. b"));
    EXPECT_EXCEPTION(luna::SemanticException, {
        Semantic("a = 1 .. 1");
    });
    EXPECT_EXCEPTION(luna::SemanticException, {
        Semantic("a = true .. nil");
    });
}